

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCompareNodeSets(int inf,int strict,xmlXPathObjectPtr arg1,xmlXPathObjectPtr arg2)

{
  xmlNodeSetPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  if ((arg1->type | XPATH_USERS) == XPATH_XSLT_TREE) {
    if (((((arg2->type | XPATH_USERS) == XPATH_XSLT_TREE) &&
         (pxVar1 = arg1->nodesetval, pxVar1 != (xmlNodeSetPtr)0x0)) && (0 < pxVar1->nodeNr)) &&
       ((pxVar2 = arg2->nodesetval, pxVar2 != (xmlNodeSetPtr)0x0 && (0 < (long)pxVar2->nodeNr)))) {
      pvVar5 = (*xmlMalloc)((long)pxVar2->nodeNr << 3);
      if (pvVar5 == (void *)0x0) {
        iVar4 = 0;
        xmlXPathErrMemory((xmlXPathContextPtr)0x0,"comparing nodesets\n");
      }
      else {
        bVar8 = strict == 0;
        bVar9 = inf == 0;
        iVar4 = 0;
        bVar3 = false;
        for (lVar6 = 0; lVar6 < pxVar1->nodeNr; lVar6 = lVar6 + 1) {
          dVar10 = xmlXPathCastNodeToNumber(pxVar1->nodeTab[lVar6]);
          if (!NAN(dVar10)) {
            for (lVar7 = 0; lVar7 < pxVar2->nodeNr; lVar7 = lVar7 + 1) {
              if (bVar3) {
                dVar11 = *(double *)((long)pvVar5 + lVar7 * 8);
              }
              else {
                dVar11 = xmlXPathCastNodeToNumber(pxVar2->nodeTab[lVar7]);
                *(double *)((long)pvVar5 + lVar7 * 8) = dVar11;
              }
              if (!NAN(dVar11)) {
                if (bVar9 || bVar8) {
                  if (!bVar9 && bVar8) {
                    if (dVar10 <= dVar11) goto LAB_001d0a94;
                  }
                  else if (!bVar9 || bVar8) {
                    if ((strict == 0 && inf == 0) && (dVar11 <= dVar10)) goto LAB_001d0a94;
                  }
                  else if (dVar11 < dVar10) {
LAB_001d0a94:
                    iVar4 = 1;
                    goto LAB_001d0a9a;
                  }
                }
                else if (dVar10 < dVar11) goto LAB_001d0a94;
              }
            }
            bVar3 = true;
          }
        }
LAB_001d0a9a:
        (*xmlFree)(pvVar5);
      }
      xmlXPathFreeObject(arg1);
      xmlXPathFreeObject(arg2);
      return iVar4;
    }
    xmlXPathFreeObject(arg1);
  }
  xmlXPathFreeObject(arg2);
  return 0;
}

Assistant:

static int
xmlXPathCompareNodeSets(int inf, int strict,
	                xmlXPathObjectPtr arg1, xmlXPathObjectPtr arg2) {
    int i, j, init = 0;
    double val1;
    double *values2;
    int ret = 0;
    xmlNodeSetPtr ns1;
    xmlNodeSetPtr ns2;

    if ((arg1 == NULL) ||
	((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE))) {
	xmlXPathFreeObject(arg2);
        return(0);
    }
    if ((arg2 == NULL) ||
	((arg2->type != XPATH_NODESET) && (arg2->type != XPATH_XSLT_TREE))) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
        return(0);
    }

    ns1 = arg1->nodesetval;
    ns2 = arg2->nodesetval;

    if ((ns1 == NULL) || (ns1->nodeNr <= 0)) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }
    if ((ns2 == NULL) || (ns2->nodeNr <= 0)) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }

    values2 = (double *) xmlMalloc(ns2->nodeNr * sizeof(double));
    if (values2 == NULL) {
        /* TODO: Propagate memory error. */
        xmlXPathErrMemory(NULL, "comparing nodesets\n");
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }
    for (i = 0;i < ns1->nodeNr;i++) {
	val1 = xmlXPathCastNodeToNumber(ns1->nodeTab[i]);
	if (xmlXPathIsNaN(val1))
	    continue;
	for (j = 0;j < ns2->nodeNr;j++) {
	    if (init == 0) {
		values2[j] = xmlXPathCastNodeToNumber(ns2->nodeTab[j]);
	    }
	    if (xmlXPathIsNaN(values2[j]))
		continue;
	    if (inf && strict)
		ret = (val1 < values2[j]);
	    else if (inf && !strict)
		ret = (val1 <= values2[j]);
	    else if (!inf && strict)
		ret = (val1 > values2[j]);
	    else if (!inf && !strict)
		ret = (val1 >= values2[j]);
	    if (ret)
		break;
	}
	if (ret)
	    break;
	init = 1;
    }
    xmlFree(values2);
    xmlXPathFreeObject(arg1);
    xmlXPathFreeObject(arg2);
    return(ret);
}